

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forced_max_frame_width_height_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_10a46b6::EncodeForcedMaxFrameWidthHeight_SecondFrameTooBig_Test::TestBody
          (EncodeForcedMaxFrameWidthHeight_SecondFrameTooBig_Test *this)

{
  aom_codec_err_t aVar1;
  aom_codec_iface_t *iface;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  SEARCH_METHODS *pSVar2;
  AssertHelper local_498;
  AssertHelper local_490;
  AssertionResult gtest_ar_3;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> img_data;
  aom_codec_ctx_t enc;
  aom_image_t img;
  aom_codec_enc_cfg_t cfg;
  
  img_data._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       operator_new__(0x18000);
  img.fmt = AOM_IMG_FMT_NONE;
  img.cp = AOM_CICP_CP_RESERVED_0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
            ((internal *)&cfg,"img_data","nullptr",&img_data,(void **)&img);
  if ((char)cfg.g_usage == '\0') {
    testing::Message::Message((Message *)&img);
    if ((undefined8 *)CONCAT44(cfg.g_w,cfg.g_profile) == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = *(SEARCH_METHODS **)CONCAT44(cfg.g_w,cfg.g_profile);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&enc,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
               ,0xfe,(char *)pSVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&enc,(Message *)&img);
    this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cfg.g_profile;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&enc);
    if (img._0_8_ != 0) {
      (**(code **)(*(long *)img._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cfg.g_profile);
    memset((void *)img_data._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x80,0x18000);
    iface = aom_codec_av1_cx();
    enc.name._0_4_ = 0;
    gtest_ar_3._0_4_ = aom_codec_enc_config_default(iface,&cfg,1);
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&img,"AOM_CODEC_OK","aom_codec_enc_config_default(iface, &cfg, 1u)",
               (aom_codec_err_t *)&enc,(aom_codec_err_t *)&gtest_ar_3);
    if ((undefined1)img.fmt == AOM_IMG_FMT_NONE) {
      testing::Message::Message((Message *)&enc);
      if (img._8_8_ == 0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = *(SEARCH_METHODS **)img._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
                 ,0x104,(char *)pSVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&enc);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
      if ((long *)CONCAT44(enc.name._4_4_,enc.name._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(enc.name._4_4_,enc.name._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&img.tc);
    cfg.g_w = 0x80;
    cfg.g_h = 0x80;
    cfg.g_forced_max_frame_width = 0xff;
    cfg.g_forced_max_frame_height = 0x100;
    gtest_ar_3.success_ = false;
    gtest_ar_3._1_3_ = 0;
    local_498.data_._0_4_ = aom_codec_enc_init_ver(&enc,iface,&cfg,0,0x1d);
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&img,"AOM_CODEC_OK",
               "aom_codec_enc_init_ver(&enc, iface, &cfg, 0, (10 + (7 + (9)) + 3))",
               (aom_codec_err_t *)&gtest_ar_3,(aom_codec_err_t *)&local_498);
    if ((undefined1)img.fmt == AOM_IMG_FMT_NONE) {
      testing::Message::Message((Message *)&gtest_ar_3);
      if (img._8_8_ == 0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = *(SEARCH_METHODS **)img._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_498,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
                 ,0x10a,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_498,(Message *)&gtest_ar_3);
      testing::internal::AssertHelper::~AssertHelper(&local_498);
      if ((long *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&img.tc);
    local_498.data_ = (AssertHelperData *)&img;
    local_490.data_ =
         (AssertHelperData *)
         aom_img_wrap(&img,AOM_IMG_FMT_I420,0x80,0x80,1,
                      (uchar *)img_data._M_t.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    testing::internal::CmpHelperEQ<aom_image*,aom_image*>
              ((internal *)&gtest_ar_3,"&img",
               "aom_img_wrap(&img, AOM_IMG_FMT_I420, 128, 128, 1, img_data.get())",
               (aom_image **)&local_498,(aom_image **)&local_490);
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&local_498);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = *(SEARCH_METHODS **)
                  gtest_ar_3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_490,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
                 ,0x10e,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_498);
      testing::internal::AssertHelper::~AssertHelper(&local_490);
      if ((aom_image_t *)local_498.data_ != (aom_image_t *)0x0) {
        (**(code **)(*(long *)local_498.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_3.message_);
    local_498.data_ = local_498.data_ & 0xffffffff00000000;
    aVar1 = aom_codec_encode(&enc,&img,0,1,0);
    local_490.data_._0_4_ = aVar1;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&gtest_ar_3,"AOM_CODEC_OK","aom_codec_encode(&enc, &img, 0, 1, 0)",
               (aom_codec_err_t *)&local_498,(aom_codec_err_t *)&local_490);
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&local_498);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = *(SEARCH_METHODS **)
                  gtest_ar_3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_490,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
                 ,0x10f,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_498);
      testing::internal::AssertHelper::~AssertHelper(&local_490);
      if (local_498.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_498.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_3.message_);
    cfg.g_w = 0x100;
    cfg.g_h = 0x100;
    local_498.data_._0_4_ = 8;
    aVar1 = aom_codec_enc_config_set(&enc,&cfg);
    local_490.data_._0_4_ = aVar1;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&gtest_ar_3,"AOM_CODEC_INVALID_PARAM",
               "aom_codec_enc_config_set(&enc, &cfg)",(aom_codec_err_t *)&local_498,
               (aom_codec_err_t *)&local_490);
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&local_498);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = *(SEARCH_METHODS **)
                  gtest_ar_3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_490,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
                 ,0x113,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_498);
      testing::internal::AssertHelper::~AssertHelper(&local_490);
      if (local_498.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_498.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_3.message_);
    local_498.data_ = local_498.data_ & 0xffffffff00000000;
    aVar1 = aom_codec_destroy(&enc);
    local_490.data_._0_4_ = aVar1;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&gtest_ar_3,"AOM_CODEC_OK","aom_codec_destroy(&enc)",
               (aom_codec_err_t *)&local_498,(aom_codec_err_t *)&local_490);
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&local_498);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = *(SEARCH_METHODS **)
                  gtest_ar_3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_490,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/forced_max_frame_width_height_test.cc"
                 ,0x115,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_490,(Message *)&local_498);
      testing::internal::AssertHelper::~AssertHelper(&local_490);
      if (local_498.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_498.data_ + 8))();
      }
    }
    this_00 = &gtest_ar_3.message_;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&img_data);
  return;
}

Assistant:

TEST(EncodeForcedMaxFrameWidthHeight, SecondFrameTooBig) {
  // A buffer of gray samples. Large enough for 128x128 and 256x256, YUV 4:2:0.
  constexpr size_t kImageDataSize = 256 * 256 + 2 * 128 * 128;
  std::unique_ptr<unsigned char[]> img_data(new unsigned char[kImageDataSize]);
  ASSERT_NE(img_data, nullptr);
  memset(img_data.get(), 128, kImageDataSize);

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(AOM_CODEC_OK,
            aom_codec_enc_config_default(iface, &cfg, AOM_USAGE_REALTIME));
  cfg.g_w = 128;
  cfg.g_h = 128;
  cfg.g_forced_max_frame_width = 255;
  cfg.g_forced_max_frame_height = 256;
  aom_codec_ctx_t enc;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_init(&enc, iface, &cfg, 0));

  aom_image_t img;
  EXPECT_EQ(&img,
            aom_img_wrap(&img, AOM_IMG_FMT_I420, 128, 128, 1, img_data.get()));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, &img, 0, 1, 0));

  cfg.g_w = 256;
  cfg.g_h = 256;
  EXPECT_EQ(AOM_CODEC_INVALID_PARAM, aom_codec_enc_config_set(&enc, &cfg));

  EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc));
}